

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BadCommandBufferCase::iterate(BadCommandBufferCase *this)

{
  pointer pcVar1;
  uint uVar2;
  RenderContext *renderCtx;
  deUint32 dVar3;
  deUint32 err;
  char *description;
  long lVar4;
  bool bVar5;
  deUint32 drawIndirectBuf;
  deUint32 indexBuf;
  deUint32 positionBuf;
  deUint32 vaoID;
  deUint16 indices [3];
  vector<signed_char,_std::allocator<signed_char>_> drawCommandBuffer;
  GLContext gl;
  ShaderProgram program;
  deUint32 local_4d0;
  deUint32 local_4cc;
  deUint32 local_4c8;
  deUint32 local_4c4 [2];
  undefined2 local_4bc;
  undefined1 local_4b8 [16];
  pointer local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  Enum<int,_2UL> local_490;
  long local_480 [2];
  long *local_470;
  long local_468;
  long local_460 [2];
  undefined1 local_450 [8];
  value_type local_448;
  GLContext local_428;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 local_288 [8];
  pointer pbStack_280;
  ios_base local_210 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  undefined1 local_1d8 [216];
  ShaderProgram local_100;
  
  local_2b8 = 0;
  uStack_2b0 = 0x3f80000000000000;
  local_2a8 = 0x3f800000;
  uStack_2a0 = 0x3f80000000000000;
  local_298 = 0x3f80000000000000;
  uStack_290 = 0x3f80000000000000;
  local_4bc = 1;
  local_4c4[1] = 0x20000;
  local_288 = (undefined1  [8])0x0;
  pbStack_280 = (pointer)&DAT_100000001;
  sglr::GLContext::GLContext
            (&local_428,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,1,
             (IVec4 *)local_288);
  local_4c4[0] = 0;
  local_4c8 = 0;
  local_4cc = 0;
  local_4d0 = 0;
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_288,0,0xac);
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8[8] = 0;
  local_1d8._9_7_ = 0;
  local_1d8[0x10] = 0;
  local_1d8._17_8_ = 0;
  local_490.m_getName = (GetNameFunc)local_480;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_490,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_4b8._0_8_ = (ulong)(uint)local_4b8._4_4_ << 0x20;
  local_4b8._8_8_ = &local_4a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4b8 + 8),local_490.m_getName,
             local_490.m_getName + CONCAT44(local_490._12_4_,local_490.m_value));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + (local_4b8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_4b8 + 8));
  local_470 = local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,
             "#version 310 es\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
             ,"");
  local_450._0_4_ = 1;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_448,local_470,local_468 + (long)local_470);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + ((ulong)local_450 & 0xffffffff) * 0x18),&local_448);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if (local_470 != local_460) {
    operator_delete(local_470,local_460[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._8_8_ != &local_4a0) {
    operator_delete((void *)local_4b8._8_8_,local_4a0._M_allocated_capacity + 1);
  }
  if (local_490.m_getName != (GetNameFunc)local_480) {
    operator_delete(local_490.m_getName,local_480[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  dVar3 = sglr::GLContext::getAttribLocation(&local_428,local_100.m_program.m_program,"a_position");
  local_4b8._0_8_ = (pointer)0x0;
  local_4b8._8_8_ = (pointer)0x0;
  local_4a8 = (pointer)0x0;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            ((vector<signed_char,_std::allocator<signed_char>_> *)local_4b8,
             (ulong)this->m_bufferSize);
  memset((void *)local_4b8._0_8_,0,(long)(local_4b8._8_4_ - (int)local_4b8._0_8_));
  if (this->m_writeCommandToBuffer == true) {
    uVar2 = this->m_alignment;
    pcVar1 = (pointer)(local_4b8._0_8_ + (ulong)uVar2);
    pcVar1[0] = '\x03';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\x01';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = '\0';
    pcVar1[0xd] = '\0';
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
    pcVar1 = (pointer)(local_4b8._0_8_ + (ulong)uVar2 + 0x10);
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  err = sglr::GLContext::getError(&local_428);
  glu::checkError(err,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x91d);
  sglr::GLContext::genVertexArrays(&local_428,1,local_4c4);
  sglr::GLContext::bindVertexArray(&local_428,local_4c4[0]);
  sglr::GLContext::genBuffers(&local_428,1,&local_4c8);
  sglr::GLContext::bindBuffer(&local_428,0x8892,local_4c8);
  sglr::GLContext::bufferData(&local_428,0x8892,0x30,&local_2b8,0x88e4);
  sglr::GLContext::vertexAttribPointer(&local_428,dVar3,4,0x1406,0,0,(void *)0x0);
  sglr::GLContext::vertexAttribDivisor(&local_428,dVar3,0);
  sglr::GLContext::enableVertexAttribArray(&local_428,dVar3);
  dVar3 = sglr::GLContext::getError(&local_428);
  glu::checkError(dVar3,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x927);
  sglr::GLContext::genBuffers(&local_428,1,&local_4cc);
  sglr::GLContext::bindBuffer(&local_428,0x8893,local_4cc);
  sglr::GLContext::bufferData(&local_428,0x8893,6,local_4c4 + 1,0x88e4);
  dVar3 = sglr::GLContext::getError(&local_428);
  glu::checkError(dVar3,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x92c);
  sglr::GLContext::genBuffers(&local_428,1,&local_4d0);
  sglr::GLContext::bindBuffer(&local_428,0x8f3f,local_4d0);
  sglr::GLContext::bufferData
            (&local_428,0x8f3f,local_4b8._8_8_ - local_4b8._0_8_,(void *)local_4b8._0_8_,0x88e4);
  dVar3 = sglr::GLContext::getError(&local_428);
  glu::checkError(dVar3,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x931);
  sglr::GLContext::viewport(&local_428,0,0,1,1);
  sglr::GLContext::useProgram(&local_428,local_100.m_program.m_program);
  sglr::GLContext::drawElementsIndirect(&local_428,4,0x1403,(void *)(ulong)this->m_alignment);
  dVar3 = sglr::GLContext::getError(&local_428);
  sglr::GLContext::useProgram(&local_428,0);
  sglr::GLContext::deleteBuffers(&local_428,1,&local_4d0);
  sglr::GLContext::deleteBuffers(&local_428,1,&local_4cc);
  sglr::GLContext::deleteBuffers(&local_428,1,&local_4c8);
  sglr::GLContext::deleteVertexArrays(&local_428,1,local_4c4);
  local_288 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_280);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pbStack_280,"drawElementsIndirect generated ",0x1f);
  local_450 = (undefined1  [8])glu::getErrorName;
  local_448._M_dataplus._M_p._0_4_ = dVar3;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_450,(ostream *)&pbStack_280);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pbStack_280,", expecting ",0xc);
  local_490.m_value = this->m_expectedError;
  local_490.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_490,(ostream *)&pbStack_280);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pbStack_280,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_280);
  std::ios_base::~ios_base(local_210);
  bVar5 = dVar3 != this->m_expectedError;
  if (bVar5) {
    local_288 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pbStack_280,"\tUnexpected error.",0x12);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_280);
    std::ios_base::~ios_base(local_210);
    description = "Got unexpected error.";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar5,description)
  ;
  if ((pointer)local_4b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_4b8._0_8_,(long)local_4a8 - local_4b8._0_8_);
  }
  glu::ShaderProgram::~ShaderProgram(&local_100);
  sglr::GLContext::~GLContext(&local_428);
  return STOP;
}

Assistant:

BadCommandBufferCase::IterateResult	BadCommandBufferCase::iterate (void)
{
	const tcu::Vec4 vertexPositions[] =
	{
		tcu::Vec4(0,	0,		0, 1),
		tcu::Vec4(1,	0,		0, 1),
		tcu::Vec4(0,	1,		0, 1),
	};

	const deUint16 indices[] =
	{
		0, 2, 1,
	};

	DE_STATIC_ASSERT(CommandSize == sizeof(DrawElementsCommand));

	sglr::GLContext gl(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(0, 0, 1, 1));

	deUint32 vaoID			= 0;
	deUint32 positionBuf	= 0;
	deUint32 indexBuf		= 0;
	deUint32 drawIndirectBuf= 0;
	deUint32 error;

	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_commonVertexShaderSource) << glu::FragmentSource(s_commonFragmentShaderSource));
	deUint32			programID		= program.getProgram();
	deInt32				posLocation		= gl.getAttribLocation(programID, "a_position");

	DrawElementsCommand drawCommand;
	drawCommand.count				= 3;
	drawCommand.primCount			= 1;
	drawCommand.firstIndex			= 0;
	drawCommand.baseVertex			= 0;
	drawCommand.reservedMustBeZero	= 0;

	std::vector<deInt8> drawCommandBuffer;
	drawCommandBuffer.resize(m_bufferSize);

	deMemset(&drawCommandBuffer[0], 0, (int)drawCommandBuffer.size());

	if (m_writeCommandToBuffer)
	{
		DE_ASSERT(drawCommandBuffer.size() >= sizeof(drawCommand) + m_alignment);
		deMemcpy(&drawCommandBuffer[m_alignment], &drawCommand, sizeof(drawCommand));
	}

	glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	gl.genVertexArrays(1, &vaoID);
	gl.bindVertexArray(vaoID);

	gl.genBuffers(1, &positionBuf);
	gl.bindBuffer(GL_ARRAY_BUFFER, positionBuf);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.vertexAttribDivisor(posLocation, 0);
	gl.enableVertexAttribArray(posLocation);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.genBuffers(1, &indexBuf);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(indices), indices, GL_STATIC_DRAW);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.genBuffers(1, &drawIndirectBuf);
	gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, drawIndirectBuf);
	gl.bufferData(GL_DRAW_INDIRECT_BUFFER, drawCommandBuffer.size(), &drawCommandBuffer[0], GL_STATIC_DRAW);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.viewport(0, 0, 1, 1);

	gl.useProgram(programID);
	gl.drawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, (const void*)(deUintptr)m_alignment);

	error = gl.getError();

	gl.useProgram(0);

	gl.deleteBuffers(1, &drawIndirectBuf);
	gl.deleteBuffers(1, &indexBuf);
	gl.deleteBuffers(1, &positionBuf);
	gl.deleteVertexArrays(1, &vaoID);

	m_testCtx.getLog() << tcu::TestLog::Message << "drawElementsIndirect generated " << glu::getErrorStr(error) << ", expecting " << glu::getErrorStr(m_expectedError) << "." << tcu::TestLog::EndMessage;

	if (error == m_expectedError)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tUnexpected error." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got unexpected error.");
	}

	return STOP;
}